

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O1

void pluslvl(boolean incr)

{
  char cVar1;
  bool bVar3;
  schar sVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  char cVar2;
  
  if (incr == '\0') {
    pline("You feel more experienced.");
  }
  iVar5 = newhp();
  u.uhpmax = u.uhpmax + iVar5;
  u.uhp = u.uhp + iVar5;
  if (u.umonnum != u.umonster) {
    uVar6 = mt_random();
    iVar5 = (uVar6 & 7) + 1;
    u.mhmax = u.mhmax + iVar5;
    u.mh = u.mh + iVar5;
  }
  iVar5 = u.ulevel;
  iVar9 = (int)urole.xlev;
  sVar4 = acurr(2);
  if (iVar5 < iVar9) {
    lVar8 = (long)urole.enadv.lornd;
    lVar10 = (long)urace.enadv.lornd;
    uVar6 = mt_random();
    iVar5 = SUB164(ZEXT416(uVar6) % SEXT816(lVar10 + sVar4 / '\x02' + lVar8),0);
    cVar1 = urole.enadv.lofix;
    cVar2 = urace.enadv.lofix;
  }
  else {
    lVar8 = (long)urole.enadv.hirnd;
    lVar10 = (long)urace.enadv.hirnd;
    uVar6 = mt_random();
    iVar5 = SUB164(ZEXT416(uVar6) % SEXT816(lVar10 + sVar4 / '\x02' + lVar8),0);
    cVar1 = urole.enadv.hifix;
    cVar2 = urace.enadv.hifix;
  }
  iVar5 = (int)cVar2 + (int)cVar1 + iVar5;
  uVar6 = (ushort)urole.malenum - 0x15a;
  if (uVar6 < 0xf) {
    if ((0x30U >> (uVar6 & 0x1f) & 1) == 0) {
      if ((0x2001U >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0x4080U >> (uVar6 & 0x1f) & 1) != 0) {
          iVar5 = iVar5 * 2;
        }
      }
      else {
        iVar9 = iVar5 * 3 + 3;
        if (-1 < iVar5 * 3) {
          iVar9 = iVar5 * 3;
        }
        iVar5 = iVar9 >> 2;
      }
    }
    else {
      iVar5 = (iVar5 * 3) / 2;
    }
  }
  u.uenmax = u.uenmax + iVar5;
  u.uen = u.uen + iVar5;
  if (0x1d < u.ulevel) {
    iflags.botl = '\x01';
    return;
  }
  if (incr == '\0') {
    if (u.ulevel < 10) {
      lVar8 = 10;
      iVar5 = u.ulevel;
    }
    else {
      if (0x13 < u.ulevel) {
        u.uexp = (u.ulevel + -0x13) * 10000000;
        goto LAB_0019bce1;
      }
      iVar5 = u.ulevel + -10;
      lVar8 = 10000;
    }
    u.uexp = (int)(lVar8 << ((byte)iVar5 & 0x3f));
    goto LAB_0019bce1;
  }
  if (u.ulevel < 9) {
    bVar7 = (char)u.ulevel + 1;
    lVar8 = 10;
LAB_0019bc9f:
    lVar8 = lVar8 << (bVar7 & 0x3f);
  }
  else {
    if (u.ulevel < 0x13) {
      bVar7 = (char)u.ulevel - 9;
      lVar8 = 10000;
      goto LAB_0019bc9f;
    }
    lVar8 = (ulong)(u.ulevel - 0x12) * 10000000;
  }
  if (lVar8 <= u.uexp) {
    u.uexp = (int)lVar8 + -1;
  }
LAB_0019bce1:
  iVar5 = u.ulevel + 1;
  bVar3 = u.ulevelmax <= u.ulevel;
  u.ulevel = iVar5;
  if (bVar3) {
    u.ulevelmax = iVar5;
    historic_event('\0',"advanced to experience level %d.");
  }
  pline("Welcome to experience level %d.",(ulong)(uint)u.ulevel);
  adjabil(u.ulevel + -1,u.ulevel);
  reset_rndmonst(-1);
  iflags.botl = '\x01';
  return;
}

Assistant:

void pluslvl(boolean incr)
{
	int num;

	if (!incr) pline("You feel more experienced.");
	num = newhp();
	u.uhpmax += num;
	u.uhp += num;
	if (Upolyd) {
	    num = rnd(8);
	    u.mhmax += num;
	    u.mh += num;
	}
	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);	/* M. Stephenson */
	u.uenmax += num;
	u.uen += num;
	if (u.ulevel < MAXULEV) {
	    if (incr) {
		long tmp = newuexp(u.ulevel + 1);
		if (u.uexp >= tmp) u.uexp = tmp - 1;
	    } else {
		u.uexp = newuexp(u.ulevel);
	    }
	    ++u.ulevel;
	    if (u.ulevelmax < u.ulevel) {
		u.ulevelmax = u.ulevel;
		historic_event(FALSE, "advanced to experience level %d.", u.ulevel);
	    }
	    pline("Welcome to experience level %d.", u.ulevel);
	    adjabil(u.ulevel - 1, u.ulevel);	/* give new intrinsics */
	    reset_rndmonst(NON_PM);		/* new monster selection */
	}
	iflags.botl = 1;
}